

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::simplify(Solver *this)

{
  int iVar1;
  char *pcVar2;
  Lit *pLVar3;
  CRef CVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  Size nelems;
  int iVar8;
  int iVar9;
  
  if ((this->trail_lim).sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x283,"bool Minisat::Solver::simplify()");
  }
  if ((this->ok != true) || (CVar4 = propagate(this), CVar4 != 0xffffffff)) {
    this->ok = false;
    return false;
  }
  if ((this->trail).sz == this->simpDB_assigns) {
    return true;
  }
  if (0 < this->simpDB_props) {
    return true;
  }
  removeSatisfied(this,&this->learnts);
  if (this->remove_satisfied == true) {
    removeSatisfied(this,&this->clauses);
    if (0 < (this->released_vars).sz) {
      lVar5 = 0;
      do {
        iVar6 = (this->released_vars).data[lVar5];
        if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar6)
        goto LAB_0010c26b;
        pcVar2 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
        if (pcVar2[iVar6] != '\0') {
          __assert_fail("seen[released_vars[i]] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                        ,0x294,"bool Minisat::Solver::simplify()");
        }
        pcVar2[iVar6] = '\x01';
        lVar5 = lVar5 + 1;
      } while (lVar5 < (this->released_vars).sz);
    }
    iVar6 = (this->trail).sz;
    if (iVar6 < 1) {
      nelems = 0;
    }
    else {
      pLVar3 = (this->trail).data;
      pcVar2 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
      lVar5 = 0;
      iVar8 = 0;
      do {
        iVar1 = pLVar3[lVar5].x;
        iVar9 = iVar1 >> 1;
        if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar9)
        goto LAB_0010c26b;
        if (pcVar2[iVar9] == '\0') {
          lVar7 = (long)iVar8;
          iVar8 = iVar8 + 1;
          pLVar3[lVar7].x = iVar1;
          iVar6 = (this->trail).sz;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar6);
      nelems = (int)lVar5 - iVar8;
    }
    vec<Minisat::Lit,_int>::shrink(&this->trail,nelems);
    this->qhead = (this->trail).sz;
    if (0 < (this->released_vars).sz) {
      lVar5 = 0;
      do {
        iVar6 = (this->released_vars).data[lVar5];
        if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar6) {
LAB_0010c26b:
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                        ,0x28,
                        "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar6] = '\0';
        lVar5 = lVar5 + 1;
      } while (lVar5 < (this->released_vars).sz);
    }
    append<int>(&this->released_vars,&this->free_vars);
    if ((this->released_vars).data != (int *)0x0) {
      (this->released_vars).sz = 0;
    }
  }
  if ((double)(this->ca).ra.sz * this->garbage_frac < (double)(this->ca).ra.wasted_) {
    (*this->_vptr_Solver[2])(this);
  }
  rebuildOrderHeap(this);
  this->simpDB_assigns = (this->trail).sz;
  this->simpDB_props = this->learnts_literals + this->clauses_literals;
  return true;
}

Assistant:

bool Solver::simplify()
{
    assert(decisionLevel() == 0);

    if (!ok || propagate() != CRef_Undef)
        return ok = false;

    if (nAssigns() == simpDB_assigns || (simpDB_props > 0))
        return true;

    // Remove satisfied clauses:
    removeSatisfied(learnts);
    if (remove_satisfied){       // Can be turned off.
        removeSatisfied(clauses);

        // TODO: what todo in if 'remove_satisfied' is false?

        // Remove all released variables from the trail:
        for (int i = 0; i < released_vars.size(); i++){
            assert(seen[released_vars[i]] == 0);
            seen[released_vars[i]] = 1;
        }

        int i, j;
        for (i = j = 0; i < trail.size(); i++)
            if (seen[var(trail[i])] == 0)
                trail[j++] = trail[i];
        trail.shrink(i - j);
        //printf("trail.size()= %d, qhead = %d\n", trail.size(), qhead);
        qhead = trail.size();

        for (int i = 0; i < released_vars.size(); i++)
            seen[released_vars[i]] = 0;

        // Released variables are now ready to be reused:
        append(released_vars, free_vars);
        released_vars.clear();
    }
    checkGarbage();
    rebuildOrderHeap();

    simpDB_assigns = nAssigns();
    simpDB_props   = clauses_literals + learnts_literals;   // (shouldn't depend on stats really, but it will do for now)

    return true;
}